

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interleaved_sudoku.cpp
# Opt level: O2

void __thiscall
InterleavedSudoku::chooseOpenFieldInTestFieldsAndFixToSolution
          (InterleavedSudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields,
          int maxPossible,bool fixFieldChooseRandomly,bool debug)

{
  pointer psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int value;
  ostream *poVar6;
  undefined7 in_register_00000009;
  pointer psVar7;
  vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *__range2;
  
  if ((int)CONCAT71(in_register_00000009,fixFieldChooseRandomly) == 0) {
    psVar1 = (testFields->
             super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (psVar7 = (testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1)
    {
      iVar2 = Field::value((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      if ((iVar2 == 0) &&
         (iVar2 = Field::n_possible((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr), iVar2 == maxPossible)) {
        iVar2 = Field::pos_x((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        iVar3 = Field::pos_y((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        iVar4 = Field::pos_z((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        goto LAB_00118fa4;
      }
    }
    iVar4 = 0;
    iVar3 = 0;
    iVar2 = 0;
  }
  else {
    do {
      iVar2 = rand();
      iVar2 = iVar2 % (this->super_Sudoku).squared_size_;
      iVar3 = rand();
      iVar3 = iVar3 % (this->super_Sudoku).squared_size_;
      iVar4 = rand();
      iVar4 = iVar4 % 2;
      iVar5 = (this->super_Sudoku).squared_size_;
      iVar5 = Field::value((testFields->
                           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           )._M_impl.super__Vector_impl_data._M_start
                           [(iVar5 * iVar4 + iVar3) * iVar5 + iVar2].
                           super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    } while (iVar5 != 0);
  }
LAB_00118fa4:
  iVar5 = (this->super_Sudoku).squared_size_;
  value = Field::value((this->super_Sudoku).fields_.
                       super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(iVar5 * iVar4 + iVar3) * iVar5 + iVar2].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar5 = (this->super_Sudoku).squared_size_;
  Field::setValue((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [(iVar5 * iVar4 + iVar3) * iVar5 + iVar2].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
  iVar5 = (this->super_Sudoku).squared_size_;
  Field::setFixed((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [(iVar5 * iVar4 + iVar3) * iVar5 + iVar2].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
  if (!debug) {
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Fix field (");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
  poVar6 = std::operator<<(poVar6,") to value ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,value);
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void InterleavedSudoku::chooseOpenFieldInTestFieldsAndFixToSolution(std::vector< std::shared_ptr< Field > >& testFields, int maxPossible, bool fixFieldChooseRandomly, bool debug)
{
  int posXtoFix = 0;
  int posYtoFix = 0;
  int posZtoFix = 0;

  if(fixFieldChooseRandomly)
  {
    for(;;)
    {
      int x = rand() % (squared_size_);
      int y = rand() % (squared_size_);
      int z = rand() % 2;
      if(testFields[index(x,y,z)]->value() == 0)
      {
	posXtoFix = x;
	posYtoFix = y;
	posZtoFix = z;
	break;
      }
    }
  }
  else
  {
    //take the first field that has the maximum number of possibilities
    for(auto &field : testFields)
    {
      if(field->value() != 0)
	continue;

      if(field->n_possible() == maxPossible)
      {
	posXtoFix = field->pos_x();
	posYtoFix = field->pos_y();
	posZtoFix = field->pos_z();
	break;
      }
    }
  }

  int correctValue = fields_[index(posXtoFix, posYtoFix, posZtoFix)]->value();

  testFields[index(posXtoFix, posYtoFix, posZtoFix)]->setValue(correctValue);
  testFields[index(posXtoFix, posYtoFix, posZtoFix)]->setFixed(true);

  if(debug)
    std::cout<<"Fix field ("<<posXtoFix<<","<<posYtoFix<<","<<posZtoFix<<") to value "<<correctValue<<std::endl;
}